

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DTDScanner::scanMarkupDecl(DTDScanner *this,bool parseTextDecl)

{
  ReaderMgr *pRVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLSize_t XVar4;
  
  XVar3 = ReaderMgr::getNextChar(this->fReaderMgr);
  if (XVar3 == L'?') {
    bVar2 = XMLScanner::checkXMLDecl(this->fScanner,false);
    if (!bVar2) {
      scanPI(this);
      return;
    }
    if (parseTextDecl) {
      scanTextDecl(this);
      return;
    }
    XMLScanner::emitError(this->fScanner,TextDeclNotLegalHere);
    pRVar1 = this->fReaderMgr;
    do {
      XVar3 = ReaderMgr::getNextChar(pRVar1);
      if (XVar3 == L'\0') {
        return;
      }
    } while (XVar3 != L'>');
  }
  else if (XVar3 == L'!') {
    bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'-');
    if (bVar2) {
      bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'-');
      if (bVar2) {
        scanComment(this);
        return;
      }
      XMLScanner::emitError(this->fScanner,CommentsMustStartWith);
      pRVar1 = this->fReaderMgr;
      do {
        XVar3 = ReaderMgr::getNextChar(pRVar1);
        if (XVar3 == L'\0') {
          return;
        }
      } while (XVar3 != L'>');
    }
    else {
      bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'[');
      if (bVar2) {
        if (this->fInternalSubset == true) {
          XMLScanner::emitError(this->fScanner,ConditionalSectInIntSubset);
          pRVar1 = this->fReaderMgr;
          do {
            XVar3 = ReaderMgr::getNextChar(pRVar1);
            if (XVar3 == L'\0') {
              return;
            }
          } while (XVar3 != L'>');
        }
        else {
          checkForPERef(this,false,true);
          bVar2 = XMLReader::skippedString
                            (this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgIncludeString);
          if (bVar2) {
            checkForPERef(this,false,true);
            bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'[');
            if (!bVar2) {
              XMLScanner::emitError(this->fScanner,ExpectedINCLUDEBracket);
            }
            XVar4 = this->fReaderMgr->fCurReader->fReaderNum;
            checkForPERef(this,false,true);
            scanExtSubsetDecl(this,true,false);
          }
          else {
            bVar2 = XMLReader::skippedString
                              (this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgIgnoreString);
            if (!bVar2) {
              XMLScanner::emitError(this->fScanner,ExpectedIncOrIgn);
              pRVar1 = this->fReaderMgr;
              do {
                XVar3 = ReaderMgr::getNextChar(pRVar1);
                if (XVar3 == L'\0') {
                  return;
                }
              } while (XVar3 != L'>');
              return;
            }
            checkForPERef(this,false,true);
            bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'[');
            if (!bVar2) {
              XMLScanner::emitError(this->fScanner,ExpectedINCLUDEBracket);
            }
            XVar4 = this->fReaderMgr->fCurReader->fReaderNum;
            scanIgnoredSection(this);
          }
          if ((this->fReaderMgr->fCurReader->fReaderNum != XVar4) &&
             (this->fScanner->fValScheme == Val_Always)) {
            XMLValidator::emitError(this->fScanner->fValidator,PartialMarkupInPE);
            return;
          }
        }
      }
      else {
        bVar2 = XMLReader::skippedString
                          (this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgAttListString);
        if (bVar2) {
          scanAttListDecl(this);
          return;
        }
        bVar2 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgElemString)
        ;
        if (bVar2) {
          scanElementDecl(this);
          return;
        }
        bVar2 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"ENTITY");
        if (bVar2) {
          scanEntityDecl(this);
          return;
        }
        bVar2 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"NOTATION");
        if (bVar2) {
          scanNotationDecl(this);
          return;
        }
        XMLScanner::emitError(this->fScanner,ExpectedMarkupDecl);
        pRVar1 = this->fReaderMgr;
        do {
          XVar3 = ReaderMgr::getNextChar(pRVar1);
          if (XVar3 == L'\0') {
            return;
          }
        } while (XVar3 != L'>');
      }
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedMarkupDecl);
    pRVar1 = this->fReaderMgr;
    do {
      XVar3 = ReaderMgr::getNextChar(pRVar1);
      if (XVar3 == L'>') {
        return;
      }
    } while (XVar3 != L'\0');
  }
  return;
}

Assistant:

void DTDScanner::scanMarkupDecl(const bool parseTextDecl)
{
    //
    //  We only have two valid first characters here. One is a ! which opens
    //  some markup decl. The other is a ?, which could begin either a PI
    //  or a text decl. If parseTextDecl is false, we cannot accept a text
    //  decl.
    //
    const XMLCh nextCh = fReaderMgr->getNextChar();

    if (nextCh == chBang)
    {
        if (fReaderMgr->skippedChar(chDash))
        {
            if (fReaderMgr->skippedChar(chDash))
            {
                scanComment();
            }
             else
            {
                fScanner->emitError(XMLErrs::CommentsMustStartWith);
                fReaderMgr->skipPastChar(chCloseAngle);
            }
        }
         else if (fReaderMgr->skippedChar(chOpenSquare))
        {
            //
            //  Its a conditional section. This is only valid in the external
            //  subset, so issue an error if we aren't there.
            //
            if (fInternalSubset)
            {
                fScanner->emitError(XMLErrs::ConditionalSectInIntSubset);
                fReaderMgr->skipPastChar(chCloseAngle);
                return;
            }

            // A PE ref can happen here, but space is not required
            checkForPERef(false, true);

            if (fReaderMgr->skippedString(XMLUni::fgIncludeString))
            {
                checkForPERef(false, true);

                // Check for the following open square bracket
                if (!fReaderMgr->skippedChar(chOpenSquare))
                    fScanner->emitError(XMLErrs::ExpectedINCLUDEBracket);

                // Get the reader we started this on
                const XMLSize_t orgReader = fReaderMgr->getCurrentReaderNum();

                checkForPERef(false, true);

                //
                //  Recurse back to the ext subset call again, telling it its
                //  in an include section.
                //
                scanExtSubsetDecl(true, false);

                //
                //  And see if we got back to the same level. If not, then its
                //  a partial markup error.
                //
                if (fReaderMgr->getCurrentReaderNum() != orgReader && fScanner->getValidationScheme() == XMLScanner::Val_Always)
                    fScanner->getValidator()->emitError(XMLValid::PartialMarkupInPE);

            }
             else if (fReaderMgr->skippedString(XMLUni::fgIgnoreString))
            {
                checkForPERef(false, true);

                // Check for the following open square bracket
                if (!fReaderMgr->skippedChar(chOpenSquare))
                    fScanner->emitError(XMLErrs::ExpectedINCLUDEBracket);

                // Get the reader we started this on
                const XMLSize_t orgReader = fReaderMgr->getCurrentReaderNum();

                // And scan over the ignored part
                scanIgnoredSection();

                //
                //  And see if we got back to the same level. If not, then its
                //  a partial markup error.
                //
                if (fReaderMgr->getCurrentReaderNum() != orgReader && fScanner->getValidationScheme() == XMLScanner::Val_Always)
                    fScanner->getValidator()->emitError(XMLValid::PartialMarkupInPE);

            }
             else
            {
                fScanner->emitError(XMLErrs::ExpectedIncOrIgn);
                fReaderMgr->skipPastChar(chCloseAngle);
            }
        }
         else if (fReaderMgr->skippedString(XMLUni::fgAttListString))
        {
            scanAttListDecl();
        }
         else if (fReaderMgr->skippedString(XMLUni::fgElemString))
        {
            scanElementDecl();
        }
         else if (fReaderMgr->skippedString(XMLUni::fgEntityString))
        {
            scanEntityDecl();
        }
         else if (fReaderMgr->skippedString(XMLUni::fgNotationString))
        {
            scanNotationDecl();
        }
         else
        {
            fScanner->emitError(XMLErrs::ExpectedMarkupDecl);
            fReaderMgr->skipPastChar(chCloseAngle);
        }
    }
     else if (nextCh == chQuestion)
    {
        // It could be a PI or the XML declaration. Check for Decl
        if (fScanner->checkXMLDecl(false))
        {
            // If we are not accepting text decls, its an error
            if (parseTextDecl)
            {
                scanTextDecl();
            }
             else
            {
                // Emit the error and skip past this markup
                fScanner->emitError(XMLErrs::TextDeclNotLegalHere);
                fReaderMgr->skipPastChar(chCloseAngle);
            }
        }
         else
        {
            // It has to be a PI
            scanPI();
        }
    }
     else
    {
        // Can't be valid so emit error and try to skip past end of this decl
        fScanner->emitError(XMLErrs::ExpectedMarkupDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }
}